

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void test_cpp_wrapper_delete_then_insert_all(planck_unit_test_t *tc)

{
  Dictionary<int,_int> *pDVar1;
  
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  BppTree<int,_int>::BppTree((BppTree<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4);
  test_cpp_wrapper_delete_then_insert(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  SkipList<int,_int>::SkipList((SkipList<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0x32);
  test_cpp_wrapper_delete_then_insert(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0x32);
  test_cpp_wrapper_delete_then_insert(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  OpenAddressHash<int,_int>::OpenAddressHash
            ((OpenAddressHash<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0xa0);
  test_cpp_wrapper_delete_then_insert(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  OpenAddressFileHash<int,_int>::OpenAddressFileHash
            ((OpenAddressFileHash<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0xa0);
  test_cpp_wrapper_delete_then_insert(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  LinearHash<int,_int>::LinearHash
            ((LinearHash<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0xa0);
  test_cpp_wrapper_delete_then_insert(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  return;
}

Assistant:

void
test_cpp_wrapper_delete_then_insert_all(
	planck_unit_test_t *tc
) {
	Dictionary<int, int> *dict;

	dict = new BppTree<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int));
	test_cpp_wrapper_delete_then_insert(tc, dict);
	delete dict;

	dict = new SkipList<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	test_cpp_wrapper_delete_then_insert(tc, dict);
	delete dict;

	dict = new FlatFile<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	test_cpp_wrapper_delete_then_insert(tc, dict);
	delete dict;

	dict = new OpenAddressHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 160);
	test_cpp_wrapper_delete_then_insert(tc, dict);
	delete dict;

	dict = new OpenAddressFileHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 160);
	test_cpp_wrapper_delete_then_insert(tc, dict);
	delete dict;

	dict = new LinearHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 160);
	test_cpp_wrapper_delete_then_insert(tc, dict);
	delete dict;
}